

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_get_heap_size
                    (ma_data_converter_config *pConfig,size_t *pHeapSizeInBytes)

{
  undefined8 *in_RSI;
  ma_data_converter_heap_layout heapLayout;
  ma_result result;
  ma_data_converter_heap_layout *in_stack_00000040;
  ma_data_converter_config *in_stack_00000048;
  undefined8 local_38;
  undefined4 local_4;
  
  if (in_RSI == (undefined8 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    local_4 = ma_data_converter_get_heap_layout(in_stack_00000048,in_stack_00000040);
    if (local_4 == MA_SUCCESS) {
      *in_RSI = local_38;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_data_converter_get_heap_size(const ma_data_converter_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_data_converter_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_data_converter_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}